

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O3

void __thiscall
test::iu_FilePath_x_iutest_x_IsRootDirectory_Test::Body
          (iu_FilePath_x_iutest_x_IsRootDirectory_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *in_R9;
  FilePath path;
  AssertionResult iutest_ar;
  allocator<char> local_239;
  string local_238;
  iuFilePath local_218;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  bool local_1d8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [392];
  
  iutest::detail::iuFilePath::iuFilePath(&local_218,"path");
  if (local_218.m_path._M_string_length == 1) {
    local_1d8 = *local_218.m_path._M_dataplus._M_p != '/';
    local_1f0 = 0;
    local_1e8 = 0;
    local_1f8 = &local_1e8;
    if (!local_1d8) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_238,(internal *)&local_1f8,(AssertionResult *)"path.IsRootDirectory()",
                 "true","false",in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,local_238._M_dataplus._M_p,&local_239);
      local_1d0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
      ;
      local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x52;
      local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
      }
    }
  }
  paVar1 = &local_218.m_path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_path._M_dataplus._M_p,
                    local_218.m_path.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::iuFilePath::iuFilePath(&local_218,"/");
  if (local_218.m_path._M_string_length == 1) {
    local_1d8 = *local_218.m_path._M_dataplus._M_p == '/';
    local_1f8 = &local_1e8;
    local_1f0 = 0;
    local_1e8 = 0;
    if (local_1d8) goto LAB_0023d9d8;
  }
  else {
    local_1d8 = false;
  }
  local_1e8 = 0;
  local_1f0 = 0;
  local_1f8 = &local_1e8;
  memset((iu_global_format_stringstream *)local_1a0,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
            (&local_238,(internal *)&local_1f8,(AssertionResult *)"path.IsRootDirectory()","false",
             "true",in_R9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,local_238._M_dataplus._M_p,&local_239);
  local_1d0.m_part_result.super_iuCodeMessage.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
  ;
  local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x5a;
  local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 1;
  iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
LAB_0023d9d8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_218.m_path._M_dataplus._M_p,
                    local_218.m_path.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(FilePath, IsRootDirectory)
{
    {
        ::iutest::internal::FilePath path;
        IUTEST_EXPECT_FALSE(path.IsRootDirectory());
    }
    {
        ::iutest::internal::FilePath path("path");
        IUTEST_EXPECT_FALSE(path.IsRootDirectory());
    }
    {
#ifdef IUTEST_OS_WINDOWS
        ::iutest::internal::FilePath path("C:\\");
        IUTEST_EXPECT_TRUE(path.IsRootDirectory());
#else
        ::iutest::internal::FilePath path("/");
        IUTEST_EXPECT_TRUE(path.IsRootDirectory());
#endif
    }
}